

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O0

coda_url * __thiscall coda_url::operator=(coda_url *this,coda_url *u)

{
  bool bVar1;
  char *pcVar2;
  coda_url *in_RSI;
  coda_url *in_RDI;
  
  bVar1 = allocated(in_RDI);
  if (bVar1) {
    free(in_RDI->val_str);
  }
  bVar1 = empty(in_RSI);
  if (bVar1) {
    in_RDI->val_len = 0;
    in_RDI->dom_len = 0;
    in_RDI->val_str = (char *)0x0;
    in_RDI->dom_str = (char *)0x0;
  }
  else {
    in_RDI->val_len = in_RSI->val_len;
    in_RDI->dom_len = in_RSI->dom_len;
    pcVar2 = (char *)malloc((ulong)(in_RDI->val_len + in_RDI->dom_len + 2));
    in_RDI->val_str = pcVar2;
    memcpy(in_RDI->val_str,in_RSI->val_str,(ulong)(in_RDI->val_len + in_RDI->dom_len + 2));
    in_RDI->dom_str = in_RDI->val_str + (ulong)in_RDI->val_len + 1;
  }
  return in_RDI;
}

Assistant:

coda_url &coda_url::operator= (const coda_url &u)
{
	if (allocated())
	{
		free(val_str);
	}

	if (u.empty())
	{
		val_len = 0;
		dom_len = 0;

		val_str = NULL;
		dom_str = NULL;
	}
	else
	{
		val_len = u.val_len;
		dom_len = u.dom_len;

		val_str = (char *) malloc(val_len + dom_len + 2);
		memcpy(val_str, u.val_str, val_len + dom_len + 2);

		dom_str = val_str + val_len + 1;
	}

	return *this;
}